

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmCmpiEa<(moira::Instr)39,(moira::Mode)6,(moira::Size)1>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 uVar1;
  StrWriter *pSVar2;
  Ea<(moira::Mode)6,_(moira::Size)1> dst;
  Ea<(moira::Mode)6,_(moira::Size)1> local_44;
  
  uVar1 = dasmRead<(moira::Size)1>(this,addr);
  Op<(moira::Mode)6,(moira::Size)1>(&local_44,this,op & 7,addr);
  pSVar2 = StrWriter::operator<<(str);
  pSVar2 = StrWriter::operator<<(pSVar2);
  StrWriter::operator<<(pSVar2,(Align)(this->tab).raw);
  StrWriter::operator<<(pSVar2,(Ims)(int)(char)uVar1);
  StrWriter::operator<<(pSVar2,", ");
  StrWriter::operator<<(pSVar2,&local_44);
  return;
}

Assistant:

void
Moira::dasmCmpiEa(StrWriter &str, u32 &addr, u16 op)
{
    auto src = Ims      ( SEXT<S>(dasmRead<S>(addr)) );
    auto dst = Op <M,S> ( _____________xxx(op), addr );

    str << Ins<I>{} << Sz<S>{} << tab << src << ", " << dst;
}